

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O3

void __thiscall ncnn::PoolAllocator::fastFree(PoolAllocator *this,void *ptr)

{
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_> *plVar1
  ;
  size_t *psVar2;
  _List_node_base *p_Var3;
  PoolAllocatorPrivate *pPVar4;
  _List_node_base *p_Var5;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->d->payouts_lock);
  plVar1 = &this->d->payouts;
  p_Var5 = (_List_node_base *)plVar1;
  do {
    p_Var5 = (((_List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)plVar1) {
      fastFree();
      return;
    }
  } while (p_Var5[1]._M_prev != (_List_node_base *)ptr);
  p_Var3 = p_Var5[1]._M_next;
  psVar2 = &(this->d->payouts).
            super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
            ._M_impl._M_node._M_size;
  *psVar2 = *psVar2 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var5,0x20);
  pthread_mutex_unlock((pthread_mutex_t *)&this->d->payouts_lock);
  pthread_mutex_lock((pthread_mutex_t *)this->d);
  pPVar4 = this->d;
  p_Var5 = (_List_node_base *)operator_new(0x20);
  p_Var5[1]._M_next = p_Var3;
  p_Var5[1]._M_prev = (_List_node_base *)ptr;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar2 = &(pPVar4->budgets).
            super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
            ._M_impl._M_node._M_size;
  *psVar2 = *psVar2 + 1;
  pthread_mutex_unlock((pthread_mutex_t *)this->d);
  return;
}

Assistant:

void PoolAllocator::fastFree(void* ptr)
{
    d->payouts_lock.lock();

    // return to budgets
    std::list<std::pair<size_t, void*> >::iterator it = d->payouts.begin();
    for (; it != d->payouts.end(); ++it)
    {
        if (it->second == ptr)
        {
            size_t size = it->first;

            d->payouts.erase(it);

            d->payouts_lock.unlock();

            d->budgets_lock.lock();

            d->budgets.push_back(std::make_pair(size, ptr));

            d->budgets_lock.unlock();

            return;
        }
    }

    d->payouts_lock.unlock();

    NCNN_LOGE("FATAL ERROR! pool allocator get wild %p", ptr);
    ncnn::fastFree(ptr);
}